

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

string * lest::make_tran_string(string *txt)

{
  bool bVar1;
  string *in_RDI;
  const_iterator pos;
  ostringstream os;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffdf8;
  string *this;
  string local_1f0 [48];
  string local_1c0 [32];
  undefined8 local_1a0;
  char *local_198;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_190;
  ostringstream local_188 [183];
  char in_stack_ffffffffffffff2f;
  
  this = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  local_198 = (char *)std::__cxx11::string::begin();
  local_190._M_current = local_198;
  while( true ) {
    local_1a0 = std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)this,in_stack_fffffffffffffdf8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*(&local_190);
    transformed_abi_cxx11_(in_stack_ffffffffffffff2f);
    std::operator<<((ostream *)local_188,local_1c0);
    std::__cxx11::string::~string(local_1c0);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_190);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::string(this,local_1f0);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

inline std::string make_tran_string( std::string const & txt )
{
    std::ostringstream os;
    for( std::string::const_iterator pos = txt.begin(); pos != txt.end(); ++pos )
        os << transformed( *pos );
    return os.str();
}